

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::TokenManager::GetPublicKeyInToken
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aPublicKey)

{
  string *this_00;
  ErrorCode EVar1;
  uint8_t *aBuf;
  size_t publicKeyLength;
  CborMap token;
  CborMap publicKey;
  CborMap cnf;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  char local_90 [16];
  size_type local_80;
  CborValue local_78;
  CborValue local_60;
  CborValue local_48;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  CborValue::CborValue(&local_78);
  local_78._vptr_CborValue = (_func_int **)&PTR__CborValue_0028ad40;
  CborValue::CborValue(&local_48);
  local_48._vptr_CborValue = (_func_int **)&PTR__CborValue_0028ad40;
  CborValue::CborValue(&local_60);
  local_60._vptr_CborValue = (_func_int **)&PTR__CborValue_0028ad40;
  ValidateToken((Error *)local_a8,this,(CborMap *)&local_78,&this->mSignedToken,
                &this->mDomainCAPublicKey);
  __return_storage_ptr__->mCode = local_a8._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_a0);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_a0._M_p != local_90) {
    operator_delete(local_a0._M_p);
  }
  if (EVar1 == kNone) {
    CborMap::Get((Error *)local_a8,(CborMap *)&local_78,8,(CborMap *)&local_48);
    __return_storage_ptr__->mCode = local_a8._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_a0);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_a0._M_p != local_90) {
      operator_delete(local_a0._M_p);
    }
    if (EVar1 == kNone) {
      CborMap::Get((Error *)local_a8,(CborMap *)&local_48,1,(CborMap *)&local_60);
      __return_storage_ptr__->mCode = local_a8._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_a0);
      EVar1 = __return_storage_ptr__->mCode;
      if (local_a0._M_p != local_90) {
        operator_delete(local_a0._M_p);
      }
      if (EVar1 == kNone) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(aPublicKey,0x400);
        aBuf = (aPublicKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
        CborValue::Serialize
                  ((Error *)local_a8,&local_60,aBuf,&local_80,
                   (long)(aPublicKey->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)aBuf);
        if (local_a0._M_p != local_90) {
          operator_delete(local_a0._M_p);
        }
        if (local_a8._0_4_ != kNone) {
          abort();
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(aPublicKey,local_80);
      }
    }
  }
  CborValue::Free(&local_78);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::GetPublicKeyInToken(ByteArray &aPublicKey) const
{
    static constexpr size_t kMaxSignedTokenLength = 1024;

    Error   error;
    CborMap token;
    CborMap cnf;
    CborMap publicKey;
    size_t  publicKeyLength;

    SuccessOrExit(error = ValidateToken(token, mSignedToken, mDomainCAPublicKey));
    SuccessOrExit(error = token.Get(cwt::kCnf, cnf));
    SuccessOrExit(error = cnf.Get(cwt::kCoseKey, publicKey));

    aPublicKey.resize(kMaxSignedTokenLength);
    SuccessOrDie(publicKey.Serialize(aPublicKey.data(), publicKeyLength, aPublicKey.size()));
    aPublicKey.resize(publicKeyLength);

exit:
    token.Free();
    return error;
}